

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::ArrayMapMethod::~ArrayMapMethod(ArrayMapMethod *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~ArrayMapMethod((ArrayMapMethod *)0x131a658);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

ArrayMapMethod() : SystemSubroutine(KnownSystemName::Map, SubroutineKind::Function) {
        withClauseMode = WithClauseMode::Iterator;
    }